

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  uint uVar1;
  CType *pCVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  MSize local_34;
  
  __n = (size_t)sz;
  if (len == 1) {
    iVar3 = lj_cconv_multi_init(cts,d,o);
    if (iVar3 == 0) {
      lj_cconv_ct_tv(cts,d,dp,o,0);
      return;
    }
  }
  else if (len == 0) goto LAB_00140af7;
  uVar1 = d->info;
  uVar4 = uVar1 >> 0x1c;
  if (uVar4 == 1) {
    local_34 = 0;
    memset(dp,0,__n);
    cconv_substruct_init(cts,d,dp,o,len,&local_34);
    if (local_34 < len) {
      cconv_err_initov(cts,d);
    }
  }
  else {
    if (uVar4 != 3) {
      cconv_err_initov(cts,d);
    }
    pCVar2 = cts->tab;
    uVar4 = pCVar2[uVar1 & 0xffff].size;
    if (sz < uVar4 * len) {
      cconv_err_initov(cts,d);
    }
    uVar7 = (ulong)len;
    uVar6 = 0;
    while( true ) {
      uVar5 = (uint)uVar6;
      bVar8 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar8) break;
      lj_cconv_ct_tv(cts,pCVar2 + (uVar1 & 0xffff),dp + uVar6,o,0);
      uVar6 = (ulong)(uVar5 + uVar4);
      o = o + 1;
    }
    uVar7 = (ulong)uVar4;
    if (uVar4 != uVar5) {
      dp = dp + uVar6;
      __n = (size_t)(sz - uVar5);
LAB_00140af7:
      memset(dp,0,__n);
      return;
    }
    for (; (uint)uVar7 < sz; uVar7 = (ulong)((uint)uVar7 + uVar4)) {
      memcpy(dp + uVar7,dp,(ulong)uVar4);
    }
  }
  return;
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}